

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall date_parse_result::def_time(date_parse_result *this,int m,int h,int s,int ms)

{
  int iVar1;
  
  iVar1 = this->hh;
  if (this->ampm == 2) {
    if (iVar1 < 0xc) {
      this->hh = iVar1 + 0xc;
    }
  }
  else if ((this->ampm == 1) && (iVar1 == 0xc)) {
    this->hh = 0;
  }
  return;
}

Assistant:

void def_time(int m, int h, int s, int ms)
    {
        /* apply the PM indicator to the time, if present and in range */
        if (ampm == 1 && hh == 12)
            hh = 0;
        else if (ampm == 2 && hh < 12)
            hh += 12;
        
        def_hour(h);
        def_minute(m);
        def_second(s);
        def_msec(ms);
    }